

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O3

int __thiscall
projects::dpg::ProductUniformFESpace<double>::init
          (ProductUniformFESpace<double> *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  ProductUniformFEDofHandler *pPVar4;
  char cVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  int extraout_EAX;
  ostream *poVar9;
  size_type __n;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
  rsf_layouts;
  stringstream ss;
  string local_230;
  string local_210;
  string local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c0;
  shared_ptr<const_lf::mesh::Mesh> local_1b8;
  ostream local_1a8 [4];
  uint local_1a4;
  undefined1 local_1a0;
  uint local_19c;
  pair<const_lf::base::RefEl,_unsigned_int> local_198 [45];
  
  peVar3 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"No mesh",7);
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"mesh_p_ != nullptr","");
    paVar2 = &local_210.field_2;
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_230,&local_210,0xd4,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,"");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    lf::base::AssertionFailed(&local_230,&local_210,0xd4,&local_1f0);
  }
  else {
    iVar6 = (**peVar3->_vptr_Mesh)();
    if (iVar6 == 2) {
      uVar12 = (ulong)this->numComponents_;
      if (uVar12 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"0 components FE space.",0x16);
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,"numComponents_ != 0","");
        paVar2 = &local_210.field_2;
        local_210._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_230,&local_210,0xdc,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_210._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                   ,"");
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
        lf::base::AssertionFailed(&local_230,&local_210,0xdc,&local_1f0);
      }
      else {
        if (((((long)(this->rfs_tria_v_).
                     super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->rfs_tria_v_).
                     super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar12) &&
             ((long)(this->rfs_quad_v_).
                    super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->rfs_quad_v_).
                    super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar12)) &&
            ((long)(this->rfs_edge_v_).
                   super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rfs_edge_v_).
                   super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar12)) &&
           ((long)(this->rfs_point_v_).
                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->rfs_point_v_).
                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar12)) {
          local_1c0 = &this->num_rsf_tria_;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(local_1c0,uVar12);
          local_1c8 = &this->num_rsf_quad_;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (local_1c8,(ulong)this->numComponents_);
          local_1d0 = &this->num_rsf_edge_;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (local_1d0,(ulong)this->numComponents_);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&this->num_rsf_node_,(ulong)this->numComponents_);
          if (this->numComponents_ == 0) {
            __n = 0;
          }
          else {
            lVar11 = 0;
            uVar12 = 0;
            do {
              *(undefined4 *)
               ((long)(this->num_rsf_tria_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11) = 0;
              *(undefined4 *)
               ((long)(this->num_rsf_quad_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11) = 0;
              *(undefined4 *)
               ((long)(this->num_rsf_edge_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11) = 0;
              *(undefined4 *)
               ((long)(this->num_rsf_node_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11) = 0;
              plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                            super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4);
              if (plVar10 != (long *)0x0) {
                cVar5 = (**(code **)(*plVar10 + 0x10))();
                if (cVar5 != '\x03') {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"wrong type for triangle in component",0x24);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  paVar1 = &local_230.field_2;
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,
                             "rfs_tria_v_[component]->RefEl() == lf::base::RefEl::kTria()","");
                  paVar2 = &local_210.field_2;
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  lf::base::AssertionFailed(&local_230,&local_210,0xf5,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != paVar2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar1) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                  lf::base::AssertionFailed(&local_230,&local_210,0xf5,&local_1f0);
                  goto LAB_0015ec64;
                }
                plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                *(undefined4 *)
                 ((long)(this->num_rsf_node_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
                plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                *(undefined4 *)
                 ((long)(this->num_rsf_edge_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
                plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,0);
                *(undefined4 *)
                 ((long)(this->num_rsf_tria_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
              }
              plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                            super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4);
              if (plVar10 != (long *)0x0) {
                cVar5 = (**(code **)(*plVar10 + 0x10))();
                if (cVar5 != '\x04') {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"Wrong type for quad in component ",0x21);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  paVar1 = &local_230.field_2;
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,
                             "rfs_quad_v_[component]->RefEl() == lf::base::RefEl::kQuad()","");
                  paVar2 = &local_210.field_2;
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  lf::base::AssertionFailed(&local_230,&local_210,0x101,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != paVar2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar1) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                  lf::base::AssertionFailed(&local_230,&local_210,0x101,&local_1f0);
                  goto LAB_0015ec64;
                }
                plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                *(undefined4 *)
                 ((long)(this->num_rsf_node_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
                plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                *(undefined4 *)
                 ((long)(this->num_rsf_edge_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
                plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,0);
                *(undefined4 *)
                 ((long)(this->num_rsf_quad_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
              }
              plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                            super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4);
              if (plVar10 != (long *)0x0) {
                cVar5 = (**(code **)(*plVar10 + 0x10))();
                if (cVar5 != '\x02') {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"Wrong type for edge in component ",0x21);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  paVar1 = &local_230.field_2;
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,
                             "rfs_edge_v_[component]->RefEl() == lf::base::RefEl::kSegment()","");
                  paVar2 = &local_210.field_2;
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  lf::base::AssertionFailed(&local_230,&local_210,0x10d,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != paVar2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar1) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                  lf::base::AssertionFailed(&local_230,&local_210,0x10d,&local_1f0);
                  goto LAB_0015ec64;
                }
                plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                *(undefined4 *)
                 ((long)(this->num_rsf_node_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
                plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                uVar7 = (**(code **)(*plVar10 + 0x28))(plVar10,0);
                *(undefined4 *)
                 ((long)(this->num_rsf_edge_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11) = uVar7;
              }
              plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                            super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4);
              if (plVar10 != (long *)0x0) {
                if (*(long *)((long)&(((this->rfs_quad_v_).
                                       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar11 * 4) != 0) {
                  iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                  plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                  if (iVar6 != iVar8) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"#RSF missmatch on nodes in component",0x24);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                    plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,2);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                    plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,2);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    paVar1 = &local_230.field_2;
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_230,
                               "(rfs_tria_v_[component]->NumRefShapeFunctions(2)) == (rfs_quad_v_[component]->NumRefShapeFunctions(2))"
                               ,"");
                    paVar2 = &local_210.field_2;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    lf::base::AssertionFailed(&local_230,&local_210,0x11f,&local_1f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != paVar2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != paVar1) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","")
                    ;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                    lf::base::AssertionFailed(&local_230,&local_210,0x11f,&local_1f0);
                    goto LAB_0015ec64;
                  }
                  plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  if (iVar6 != iVar8) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"#RSF missmatch on edges in component",0x24);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                    plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,1);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                    plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    paVar1 = &local_230.field_2;
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_230,
                               "(rfs_tria_v_[component]->NumRefShapeFunctions(1)) == (rfs_quad_v_[component]->NumRefShapeFunctions(1))"
                               ,"");
                    paVar2 = &local_210.field_2;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    lf::base::AssertionFailed(&local_230,&local_210,0x126,&local_1f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != paVar2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != paVar1) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","")
                    ;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                    lf::base::AssertionFailed(&local_230,&local_210,0x126,&local_1f0);
                    goto LAB_0015ec64;
                  }
                  plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  if (plVar10 == (long *)0x0) goto LAB_0015d716;
                }
                if (*(long *)((long)&(((this->rfs_edge_v_).
                                       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar11 * 4) != 0) {
                  iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                  plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  if (iVar6 != iVar8) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"#RSF missmatch on nodes in component",0x24);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                    plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,2);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                    plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    paVar1 = &local_230.field_2;
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_230,
                               "(rfs_tria_v_[component]->NumRefShapeFunctions(2)) == (rfs_edge_v_[component]->NumRefShapeFunctions(1))"
                               ,"");
                    paVar2 = &local_210.field_2;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    lf::base::AssertionFailed(&local_230,&local_210,0x130,&local_1f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != paVar2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != paVar1) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","")
                    ;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                    lf::base::AssertionFailed(&local_230,&local_210,0x130,&local_1f0);
                    goto LAB_0015ec64;
                  }
                  plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,0);
                  if (iVar6 != iVar8) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,"#RSF missmatch on edges in component",0x24);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                    plVar10 = *(long **)((long)&(((this->rfs_tria_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,1);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                    plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11 * 4);
                    (**(code **)(*plVar10 + 0x28))(plVar10,0);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    paVar1 = &local_230.field_2;
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_230,
                               "(rfs_tria_v_[component]->NumRefShapeFunctions(1)) == (rfs_edge_v_[component]->NumRefShapeFunctions(0))"
                               ,"");
                    paVar2 = &local_210.field_2;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    lf::base::AssertionFailed(&local_230,&local_210,0x137,&local_1f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != paVar2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != paVar1) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    local_230._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","")
                    ;
                    local_210._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                               ,"");
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                    lf::base::AssertionFailed(&local_230,&local_210,0x137,&local_1f0);
                    goto LAB_0015ec64;
                  }
                }
              }
LAB_0015d716:
              plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                            super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar11 * 4);
              if ((plVar10 != (long *)0x0) &&
                 (*(long *)((long)&(((this->rfs_edge_v_).
                                     super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar11 * 4) != 0)) {
                iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,2);
                plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                if (iVar6 != iVar8) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"#RSF missmatch on nodes in component",0x24);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                  plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  (**(code **)(*plVar10 + 0x28))(plVar10,2);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                  plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  paVar1 = &local_230.field_2;
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,
                             "(rfs_quad_v_[component]->NumRefShapeFunctions(2)) == (rfs_edge_v_[component]->NumRefShapeFunctions(1))"
                             ,"");
                  paVar2 = &local_210.field_2;
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  lf::base::AssertionFailed(&local_230,&local_210,0x141,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != paVar2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar1) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                  lf::base::AssertionFailed(&local_230,&local_210,0x141,&local_1f0);
                  goto LAB_0015ec64;
                }
                plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                iVar6 = (**(code **)(*plVar10 + 0x28))(plVar10,1);
                plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                              super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11 * 4);
                iVar8 = (**(code **)(*plVar10 + 0x28))(plVar10,0);
                if (iVar6 != iVar8) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"#RSF missmatch on edges in component",0x24);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                  plVar10 = *(long **)((long)&(((this->rfs_quad_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  (**(code **)(*plVar10 + 0x28))(plVar10,1);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<->",3);
                  plVar10 = *(long **)((long)&(((this->rfs_edge_v_).
                                                super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar11 * 4);
                  (**(code **)(*plVar10 + 0x28))(plVar10,0);
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  paVar1 = &local_230.field_2;
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,
                             "(rfs_quad_v_[component]->NumRefShapeFunctions(1)) == (rfs_edge_v_[component]->NumRefShapeFunctions(0))"
                             ,"");
                  paVar2 = &local_210.field_2;
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  lf::base::AssertionFailed(&local_230,&local_210,0x148,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != paVar2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar1) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
                  local_210._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                             ,"");
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
                  lf::base::AssertionFailed(&local_230,&local_210,0x148,&local_1f0);
                  goto LAB_0015ec64;
                }
              }
              uVar12 = uVar12 + 1;
              __n = (size_type)this->numComponents_;
              lVar11 = lVar11 + 4;
            } while (uVar12 < __n);
          }
          std::
          vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
          ::vector((vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                    *)&local_230,__n,(allocator_type *)&local_1b8);
          if (this->numComponents_ != 0) {
            lVar11 = 0;
            uVar12 = 0;
            do {
              local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT71(local_1b8.
                              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._1_7_,kPoint);
              local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT44((this->num_rsf_node_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar12],
                              local_1b8.
                              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_);
              local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_1_ = 2;
              local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ =
                   (local_1d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar12];
              local_1a8[0] = (ostream)0x3;
              local_1a4 = (local_1c0->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
              local_1a0 = 4;
              local_19c = (local_1c8->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
              std::
              _Rb_tree<lf::base::RefEl,std::pair<lf::base::RefEl_const,unsigned_int>,std::_Select1st<std::pair<lf::base::RefEl_const,unsigned_int>>,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>
              ::_M_assign_unique<std::pair<lf::base::RefEl_const,unsigned_int>const*>
                        ((_Rb_tree<lf::base::RefEl,std::pair<lf::base::RefEl_const,unsigned_int>,std::_Select1st<std::pair<lf::base::RefEl_const,unsigned_int>>,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>
                          *)(local_230._M_dataplus._M_p + lVar11),
                         (pair<const_lf::base::RefEl,_unsigned_int> *)&local_1b8,local_198);
              uVar12 = uVar12 + 1;
              lVar11 = lVar11 + 0x30;
            } while (uVar12 < this->numComponents_);
          }
          std::
          make_unique<projects::dpg::ProductUniformFEDofHandler,std::shared_ptr<lf::mesh::Mesh_const>&,std::vector<std::map<lf::base::RefEl,unsigned_int,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>,std::allocator<std::map<lf::base::RefEl,unsigned_int,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>>>&>
                    (&local_1b8,
                     (vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                      *)&this->mesh_p_);
          peVar3 = local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          pPVar4 = (this->dofh_p_)._M_t.
                   super___uniq_ptr_impl<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
                   .super__Head_base<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_false>.
                   _M_head_impl;
          (this->dofh_p_)._M_t.
          super___uniq_ptr_impl<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
          ._M_t.
          super__Tuple_impl<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
          .super__Head_base<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_false>._M_head_impl =
               (ProductUniformFEDofHandler *)peVar3;
          if ((pPVar4 != (ProductUniformFEDofHandler *)0x0) &&
             ((*(pPVar4->super_DofHandler)._vptr_DofHandler[1])(),
             (pair<const_lf::base::RefEl,_unsigned_int>)
             local_1b8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             != (pair<const_lf::base::RefEl,_unsigned_int>)0x0)) {
            (**(code **)(*(long *)local_1b8.
                                  super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 8))();
          }
          std::
          vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
          ::~vector((vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                     *)&local_230);
          return extraout_EAX;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,
                   "Missmatch in number of shape functions passed for different entity tpyes.",0x49)
        ;
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,
                   "numComponents_ == rfs_tria_v_.size() && numComponents_ == rfs_quad_v_.size() && numComponents_ == rfs_edge_v_.size() && numComponents_ == rfs_point_v_.size()"
                   ,"");
        paVar2 = &local_210.field_2;
        local_210._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_230,&local_210,0xe2,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_210._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                   ,"");
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
        lf::base::AssertionFailed(&local_230,&local_210,0xe2,&local_1f0);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Only 2D cells",0xd);
      paVar1 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"mesh_p_->DimMesh() == 2","");
      paVar2 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_230,&local_210,0xd5,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                 ,"");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
      lf::base::AssertionFailed(&local_230,&local_210,0xd5,&local_1f0);
    }
  }
LAB_0015ec64:
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  abort();
}

Assistant:

void ProductUniformFESpace<SCALAR>::init() {
  // check validity and consistency of mesh pointer:
  LF_ASSERT_MSG(mesh_p_ != nullptr, "No mesh");
  LF_ASSERT_MSG(mesh_p_->DimMesh() == 2, "Only 2D cells");

  // we do not check, wheter a specification of reference finite elements
  // for cells (triangles and quadrilaterals) is given, since this may not
  // be desired necessary for some components in  a dpg method (fluxes)

  // check validity and consistency of the number of components:
  LF_ASSERT_MSG(numComponents_ != 0, "0 components FE space.");
  LF_ASSERT_MSG(numComponents_ == rfs_tria_v_.size() &&
                    numComponents_ == rfs_quad_v_.size() &&
                    numComponents_ == rfs_edge_v_.size() &&
                    numComponents_ == rfs_point_v_.size(),
                "Missmatch in number of shape functions passed for different "
                "entity tpyes.");

  // resize vectors saving the number of loal shape functions for each
  // component:
  num_rsf_tria_.resize(numComponents_);
  num_rsf_quad_.resize(numComponents_);
  num_rsf_edge_.resize(numComponents_);
  num_rsf_node_.resize(numComponents_);

  // compatibility checks and initialization of number of shape functions:
  for (size_type component = 0; component < numComponents_; component++) {
    num_rsf_tria_[component] = 0;
    num_rsf_quad_[component] = 0;
    num_rsf_edge_[component] = 0;
    num_rsf_node_[component] = 0;

    if (rfs_tria_v_[component] != nullptr) {
      // probe reference finite element
      LF_ASSERT_MSG(rfs_tria_v_[component]->RefEl() == lf::base::RefEl::kTria(),
                    "wrong type for triangle in component" << component);
      // initialize number of shape functions associated to entitites.
      num_rsf_node_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(2);
      num_rsf_edge_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(1);
      num_rsf_tria_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(0);
    }
    if (rfs_quad_v_[component] != nullptr) {
      // probe reference finite element for quads.
      LF_ASSERT_MSG(rfs_quad_v_[component]->RefEl() == lf::base::RefEl::kQuad(),
                    "Wrong type for quad in component " << component);
      // initialize number of shape functions associated to entitites.
      num_rsf_node_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(2);
      num_rsf_edge_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(1);
      num_rsf_quad_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(0);
    }
    if (rfs_edge_v_[component] != nullptr) {
      LF_ASSERT_MSG(
          rfs_edge_v_[component]->RefEl() == lf::base::RefEl::kSegment(),
          "Wrong type for edge in component " << component);
      num_rsf_node_[component] =
          rfs_edge_v_[component]->NumRefShapeFunctions(1);
      num_rsf_edge_[component] =
          rfs_edge_v_[component]->NumRefShapeFunctions(0);
    }

    // Compatibility check for numbers of local shape functions associated with
    // edges. Those must be the same for all reference shape function
    // descriptions in a component passed to the finite element space.
    if ((rfs_tria_v_[component] != nullptr) &&
        (rfs_quad_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_quad_v_[component]->NumRefShapeFunctions(2)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_quad_v_[component]->NumRefShapeFunctions(2));
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_quad_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_quad_v_[component]->NumRefShapeFunctions(1));
    }
    if ((rfs_tria_v_[component] != nullptr) &&
        (rfs_edge_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(1));
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(0)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(0));
    }
    if ((rfs_quad_v_[component] != nullptr) &&
        (rfs_edge_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_quad_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_quad_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(1));
      LF_ASSERT_MSG((rfs_quad_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(0)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_quad_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(0));
    }
  }

  // initialization of dof handler
  // collect the number of interior reference shape functions for all
  // components
  std::vector<dof_map_t> rsf_layouts(numComponents_);
  for (size_type component = 0; component < numComponents_; component++) {
    rsf_layouts[component] = {
        {lf::base::RefEl::kPoint(), num_rsf_node_[component]},
        {lf::base::RefEl::kSegment(), num_rsf_edge_[component]},
        {lf::base::RefEl::kTria(), num_rsf_tria_[component]},
        {lf::base::RefEl::kQuad(), num_rsf_quad_[component]}};
  }
  dofh_p_ = std::make_unique<ProductUniformFEDofHandler>(mesh_p_, rsf_layouts);
}